

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsbr.hpp
# Opt level: O0

void __thiscall
unodb::detail::deallocation_request::deallocate
          (deallocation_request *this,bool orphan,optional<unodb::detail::qsbr_epoch> dealloc_epoch,
          optional<bool> dealloc_epoch_single_thread_mode)

{
  bool bVar1;
  qsbr_epoch qVar2;
  bool *pbVar3;
  qsbr_epoch *pqVar4;
  bool local_53;
  bool local_52;
  bool local_51;
  bool orphan_local;
  deallocation_request *this_local;
  optional<bool> dealloc_epoch_single_thread_mode_local;
  optional<unodb::detail::qsbr_epoch> dealloc_epoch_local;
  
  this_local._4_2_ =
       (_Optional_payload_base<bool>)
       dealloc_epoch_single_thread_mode.super__Optional_base<bool,_true,_true>._M_payload.
       super__Optional_payload_base<bool>;
  this_local._6_2_ =
       (_Optional_payload_base<unodb::detail::qsbr_epoch>)
       dealloc_epoch.super__Optional_base<unodb::detail::qsbr_epoch,_true,_true>._M_payload.
       super__Optional_payload_base<unodb::detail::qsbr_epoch>;
  if ((orphan) &&
     (bVar1 = std::optional<unodb::detail::qsbr_epoch>::has_value
                        ((optional<unodb::detail::qsbr_epoch> *)((long)&this_local + 6)), !bVar1)) {
    bVar1 = std::optional<bool>::has_value((optional<bool> *)((long)&this_local + 4));
    local_51 = true;
    if (!bVar1) goto LAB_0015061b;
  }
  local_52 = false;
  if (!orphan) {
    bVar1 = std::optional<unodb::detail::qsbr_epoch>::has_value
                      ((optional<unodb::detail::qsbr_epoch> *)((long)&this_local + 6));
    local_52 = false;
    if (bVar1) {
      bVar1 = std::optional<bool>::has_value((optional<bool> *)((long)&this_local + 4));
      local_52 = false;
      if (bVar1) {
        pbVar3 = std::optional<bool>::operator*((optional<bool> *)((long)&this_local + 4));
        if ((*pbVar3 & 1U) == 0) {
LAB_001505dd:
          pqVar4 = std::optional<unodb::detail::qsbr_epoch>::operator*
                             ((optional<unodb::detail::qsbr_epoch> *)((long)&this_local + 6));
          qVar2 = qsbr_epoch::advance(&this->request_epoch,2);
          local_53 = qsbr_epoch::operator==(pqVar4,qVar2);
        }
        else {
          pqVar4 = std::optional<unodb::detail::qsbr_epoch>::operator*
                             ((optional<unodb::detail::qsbr_epoch> *)((long)&this_local + 6));
          qVar2 = qsbr_epoch::advance(&this->request_epoch,1);
          bVar1 = qsbr_epoch::operator==(pqVar4,qVar2);
          local_53 = true;
          if (!bVar1) goto LAB_001505dd;
        }
        local_52 = local_53;
      }
    }
  }
  local_51 = local_52;
LAB_0015061b:
  if (local_51 == false) {
    __assert_fail("(orphan && !dealloc_epoch.has_value() && !dealloc_epoch_single_thread_mode.has_value()) || (!orphan && dealloc_epoch.has_value() && dealloc_epoch_single_thread_mode.has_value() && ((*dealloc_epoch_single_thread_mode && *dealloc_epoch == request_epoch.advance()) || *dealloc_epoch == request_epoch.advance(2)))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./qsbr.hpp"
                  ,0x5b2,
                  "void unodb::detail::deallocation_request::deallocate(bool, std::optional<qsbr_epoch>, std::optional<bool>) const"
                 );
  }
  qsbr::deallocate(this->pointer,&this->dealloc_callback);
  LOCK();
  instance_count = instance_count + -1;
  UNLOCK();
  return;
}

Assistant:

inline void deallocation_request::deallocate(
#ifndef NDEBUG
    bool orphan, std::optional<qsbr_epoch> dealloc_epoch,
    std::optional<bool> dealloc_epoch_single_thread_mode
#endif
) const noexcept {
  // NOLINTNEXTLINE(readability-simplify-boolean-expr)
  UNODB_DETAIL_ASSERT((orphan && !dealloc_epoch.has_value() &&
                       !dealloc_epoch_single_thread_mode.has_value()) ||
                      (!orphan && dealloc_epoch.has_value() &&
                       dealloc_epoch_single_thread_mode.has_value() &&
                       ((*dealloc_epoch_single_thread_mode &&
                         *dealloc_epoch == request_epoch.advance()) ||
                        *dealloc_epoch == request_epoch.advance(2))));

  qsbr::deallocate(pointer
#ifndef NDEBUG
                   ,
                   dealloc_callback
#endif
  );

#ifndef NDEBUG
  instance_count.fetch_sub(1, std::memory_order_relaxed);
#endif
}